

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_windows.c
# Opt level: O3

int main(void)

{
  _Bool _Var1;
  uint uVar2;
  mfb_update_state mVar3;
  mfb_window *window;
  mfb_window *window_00;
  uint uVar4;
  long lVar5;
  int iVar6;
  mfb_window *window_01;
  uint32_t c;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  uint32_t pallete [512];
  float local_858;
  uint auStack_838 [64];
  uint auStack_738 [64];
  uint auStack_638 [64];
  uint auStack_538 [64];
  uint auStack_438 [64];
  uint auStack_338 [64];
  uint auStack_238 [64];
  uint auStack_138 [66];
  
  window = mfb_open_ex("Multiple Windows Test",800,600,1);
  if (window != (mfb_window *)0x0) {
    mfb_set_active_callback(window,active);
    mfb_set_resize_callback(window,resize);
    mfb_set_keyboard_callback(window,keyboard);
    mfb_set_char_input_callback(window,char_input);
    mfb_set_mouse_button_callback(window,mouse_btn);
    mfb_set_mouse_move_callback(window,mouse_move);
    mfb_set_mouse_scroll_callback(window,mouse_scroll);
    mfb_set_user_data(window,"Window A");
    mfb_set_viewport(window,0x19,0x19,0x2ee,0x226);
    window_00 = mfb_open_ex("Secondary Window",0x140,0xf0,1);
    if (window_00 != (mfb_window *)0x0) {
      mfb_set_active_callback(window_00,active);
      mfb_set_resize_callback(window_00,resize);
      mfb_set_keyboard_callback(window_00,keyboard);
      mfb_set_char_input_callback(window_00,char_input);
      mfb_set_mouse_button_callback(window_00,mouse_btn);
      mfb_set_mouse_move_callback(window_00,mouse_move);
      mfb_set_mouse_scroll_callback(window_00,mouse_scroll);
      mfb_set_user_data(window_00,"Window B");
      lVar7 = 0;
      do {
        fVar8 = sinf(((float)(int)lVar7 * 1.40625 * 3.1415927) / 180.0);
        uVar2 = (uint)(fVar8 * 255.0 + 0.5);
        auStack_838[lVar7] = uVar2 << 0x10;
        auStack_738[lVar7] = uVar2 << 8 | 0xff0000;
        uVar4 = 0xff - uVar2;
        auStack_638[lVar7] = uVar4 * 0x10000 | 0xff00;
        auStack_538[lVar7] = uVar2 | 0xff00;
        auStack_438[lVar7] = uVar4 * 0x100 | 0xff;
        auStack_338[lVar7] = uVar2 << 0x10 | 0xff;
        auStack_238[lVar7] = uVar4 | 0xff0000;
        auStack_138[lVar7] = uVar4 * 0x10000;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x40);
      mfb_set_target_fps(10);
      uVar2 = 0xbeef;
      local_858 = 0.0;
      while( true ) {
        window_01 = window_00;
        if (window == (mfb_window *)0x0) {
          window = (mfb_window *)0x0;
        }
        else {
          lVar7 = 0;
          do {
            uVar4 = (int)uVar2 >> 3 ^ uVar2;
            uVar2 = (uVar4 & 1) << 0x1e | (int)uVar2 >> 1;
            *(uint *)((long)g_buffer_a + lVar7) = (uVar4 >> 1 & 0xff) * 0x10101;
            lVar7 = lVar7 + 4;
          } while (lVar7 != 0x1d4c00);
          mVar3 = mfb_update(window,g_buffer_a);
          if (mVar3 != STATE_OK) {
            window = (mfb_window *)0x0;
          }
        }
        if (window_01 == (mfb_window *)0x0) {
          window_01 = (mfb_window *)0x0;
        }
        else {
          fVar8 = (local_858 * 3.1415927) / 180.0;
          fVar9 = sinf(fVar8);
          fVar8 = cosf(fVar8);
          iVar6 = 0;
          lVar7 = 0;
          do {
            fVar10 = cosf(((float)iVar6 * fVar8 * 3.1415927) / 180.0);
            lVar5 = 0;
            do {
              fVar11 = sinf(((float)(int)lVar5 * fVar9 * 3.1415927) / 180.0);
              g_buffer_b[lVar5 + (int)lVar7] =
                   auStack_838[(int)((fVar11 + 2.0 + fVar10) * 0.25 * 511.0)];
              lVar5 = lVar5 + 1;
            } while ((int)lVar5 != 0x140);
            iVar6 = iVar6 + 1;
            lVar7 = (int)lVar7 + lVar5;
          } while (iVar6 != 0xf0);
          local_858 = local_858 + 0.1;
          mVar3 = mfb_update(window_01,g_buffer_b);
          if (mVar3 != STATE_OK) {
            window_01 = (mfb_window *)0x0;
          }
        }
        if (window == (mfb_window *)0x0 && window_01 == (mfb_window *)0x0) break;
        if (window == (mfb_window *)0x0) {
          window = (mfb_window *)0x0;
          window_00 = (mfb_window *)0x0;
          if (window_01 != (mfb_window *)0x0) {
            _Var1 = mfb_wait_sync(window_01);
            if (!_Var1) {
              window_01 = (mfb_window *)0x0;
            }
            window = (mfb_window *)0x0;
            window_00 = window_01;
          }
        }
        else {
          _Var1 = mfb_wait_sync(window);
          window_00 = window_01;
          if (!_Var1) {
            window = (mfb_window *)0x0;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int 
main()
{
    int noise, carry, seed = 0xbeef;

    struct mfb_window *window_a = mfb_open_ex("Multiple Windows Test", WIDTH_A, HEIGHT_A, WF_RESIZABLE);
    if (!window_a)
        return 0;

    mfb_set_active_callback(window_a, active);
    mfb_set_resize_callback(window_a, resize);
    mfb_set_keyboard_callback(window_a, keyboard);
    mfb_set_char_input_callback(window_a, char_input);
    mfb_set_mouse_button_callback(window_a, mouse_btn);
    mfb_set_mouse_move_callback(window_a, mouse_move);
    mfb_set_mouse_scroll_callback(window_a, mouse_scroll);

    mfb_set_user_data(window_a, (void *) "Window A");
    mfb_set_viewport(window_a, 25, 25, WIDTH_A-50, HEIGHT_A-50);

    //--
    struct mfb_window *window_b = mfb_open_ex("Secondary Window", WIDTH_B, HEIGHT_B, WF_RESIZABLE);
    if (!window_b)
        return 0;

    mfb_set_active_callback(window_b, active);
    mfb_set_resize_callback(window_b, resize);
    mfb_set_keyboard_callback(window_b, keyboard);
    mfb_set_char_input_callback(window_b, char_input);
    mfb_set_mouse_button_callback(window_b, mouse_btn);
    mfb_set_mouse_move_callback(window_b, mouse_move);
    mfb_set_mouse_scroll_callback(window_b, mouse_scroll);

    mfb_set_user_data(window_b, (void *) "Window B");

    // Generate pallete for plasma effect
    uint32_t    pallete[512];
    float       inc = 90.0f / 64.0f;
    for(uint32_t c=0; c<64; ++c) {
        int32_t col = (int32_t) ((255.0f * sinf(c * inc * kPI / 180.0f)) + 0.5f);
        pallete[64*0 + c] = MFB_RGB(col,     0,       0);
        pallete[64*1 + c] = MFB_RGB(255,     col,     0);
        pallete[64*2 + c] = MFB_RGB(255-col, 255,     0);
        pallete[64*3 + c] = MFB_RGB(0,       255,     col);
        pallete[64*4 + c] = MFB_RGB(0,       255-col, 255);
        pallete[64*5 + c] = MFB_RGB(col,     0,       255);
        pallete[64*6 + c] = MFB_RGB(255,     0,       255-col);
        pallete[64*7 + c] = MFB_RGB(255-col, 0,       0);
    }

    mfb_set_target_fps(10);

    //--
    float   time = 0;
    for (;;)
    {
        int      i, x, y;
        float    dx, dy, time_x, time_y;
        int      index;
        
        mfb_update_state state_a, state_b;

        if(window_a != 0x0) {
            for (i = 0; i < WIDTH_A * HEIGHT_A; ++i)
            {
                noise = seed;
                noise >>= 3;
                noise ^= seed;
                carry = noise & 1;
                noise >>= 1;
                seed >>= 1;
                seed |= (carry << 30);
                noise &= 0xFF;
                g_buffer_a[i] = MFB_RGB(noise, noise, noise); 
            }

            //--
            state_a = mfb_update(window_a, g_buffer_a);
            if (state_a != STATE_OK) {
                window_a = 0x0;
            }
        }

        //--
        if(window_b != 0x0) {
            time_x = sinf(time * kPI / 180.0f);
            time_y = cosf(time * kPI / 180.0f);
            i = 0;
            for(y=0; y<HEIGHT_B; ++y) {
                dy = cosf((y * time_y) * kPI / 180.0f);                // [-1, 1]
                for(x=0; x<WIDTH_B; ++x) {
                    dx = sinf((x * time_x) * kPI / 180.0f);            // [-1, 1]

                    index = (int) ((2.0f + dx + dy) * 0.25f * 511.0f);  // [0, 511]
                    g_buffer_b[i++] = pallete[index];
                }
            }
            time += 0.1f;

            //--
            state_b = mfb_update(window_b, g_buffer_b);
            if (state_b != STATE_OK) {
                window_b = 0x0;
            }
        }

        if(window_a == 0x0 && window_b == 0x0) {
            break;
        }

        // Don't need to do this for both windows in the same thread
        if(window_a != 0x0) {
            if(mfb_wait_sync(window_a) == false) {
                window_a = 0x0;
            }
        }
        else if(window_b != 0x0) {
            if(mfb_wait_sync(window_b) == false) {
                window_b = 0x0;
            }
        }
    }

    return 0;
}